

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O2

void __thiscall
Js::JavascriptSet::ExtractSnapObjectDataInto
          (JavascriptSet *this,SnapObject *objData,SlabAllocator *alloc)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  SnapSetInfo *addtlInfo;
  void **ppvVar4;
  undefined1 local_38 [8];
  Iterator iter;
  
  addtlInfo = (SnapSetInfo *)TTD::SlabAllocatorBase<0>::SlabAllocateTypeRawSize<16ul>(alloc);
  addtlInfo->SetSize = 0;
  iVar3 = Size(this);
  if (iVar3 == 0) {
    addtlInfo->SetValueArray = (TTDVar *)0x0;
  }
  else {
    iVar3 = Size(this);
    ppvVar4 = TTD::SlabAllocatorBase<0>::SlabAllocateArray<void*>(alloc,(long)iVar3);
    addtlInfo->SetValueArray = ppvVar4;
    MapOrSetDataList<void_*>::Iterator::Iterator((Iterator *)local_38,&this->list);
    while( true ) {
      bVar2 = MapOrSetDataList<void_*>::Iterator::Next((Iterator *)local_38);
      if (!bVar2) break;
      uVar1 = addtlInfo->SetSize;
      addtlInfo->SetValueArray[uVar1] = iter.list.ptr[1].first.ptr;
      addtlInfo->SetSize = uVar1 + 1;
    }
  }
  TTD::NSSnapObjects::
  SnapObjectSetAddtlInfoAs<TTD::NSSnapObjects::SnapSetInfo*,(TTD::NSSnapObjects::SnapObjectType)25>
            (objData,addtlInfo);
  return;
}

Assistant:

void JavascriptSet::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
{
    TTD::NSSnapObjects::SnapSetInfo* ssi = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapSetInfo>();
    ssi->SetSize = 0;

    if(this->Size() == 0)
    {
        ssi->SetValueArray = nullptr;
    }
    else
    {
        ssi->SetValueArray = alloc.SlabAllocateArray<TTD::TTDVar>(this->Size());

        auto iter = this->GetIterator();
        while(iter.Next())
        {
            ssi->SetValueArray[ssi->SetSize] = iter.Current();
            ssi->SetSize++;
        }
    }

    TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapSetInfo*, TTD::NSSnapObjects::SnapObjectType::SnapSetObject>(objData, ssi);
}